

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O3

SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::create(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,DataKey *newkey,int nonzeros,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *newlhs,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *newrhs,
        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *newobj,int *newscaleExp)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int32_t iVar5;
  pointer pnVar6;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  int iVar8;
  int iVar9;
  
  iVar9 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar6 = (this->left).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar8 = (int)((ulong)((long)(this->left).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar6) >> 3);
  if (SBORROW4(iVar9,iVar8 * -0x49249249) == iVar9 + iVar8 * 0x49249249 < 0) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->left,iVar9 + 1,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->right,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum + 1,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->object,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum + 1,true);
    DataArray<int>::reSize
              (&this->scaleExp,
               (this->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thenum + 1);
    iVar9 = (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum;
    pnVar6 = (this->left).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  *(undefined8 *)((long)&pnVar6[iVar9].m_backend.data + 0x20) =
       *(undefined8 *)((newlhs->m_backend).data._M_elems + 8);
  uVar2 = *(undefined8 *)(newlhs->m_backend).data._M_elems;
  uVar3 = *(undefined8 *)((newlhs->m_backend).data._M_elems + 2);
  uVar4 = *(undefined8 *)((newlhs->m_backend).data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar6[iVar9].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((newlhs->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar4;
  *(undefined8 *)&pnVar6[iVar9].m_backend.data = uVar2;
  *(undefined8 *)((long)&pnVar6[iVar9].m_backend.data + 8) = uVar3;
  pnVar6[iVar9].m_backend.exp = (newlhs->m_backend).exp;
  pnVar6[iVar9].m_backend.neg = (newlhs->m_backend).neg;
  iVar5 = (newlhs->m_backend).prec_elem;
  pnVar6[iVar9].m_backend.fpclass = (newlhs->m_backend).fpclass;
  pnVar6[iVar9].m_backend.prec_elem = iVar5;
  iVar9 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar6 = (this->right).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar6[iVar9].m_backend.data + 0x20) =
       *(undefined8 *)((newrhs->m_backend).data._M_elems + 8);
  uVar2 = *(undefined8 *)(newrhs->m_backend).data._M_elems;
  uVar3 = *(undefined8 *)((newrhs->m_backend).data._M_elems + 2);
  uVar4 = *(undefined8 *)((newrhs->m_backend).data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar6[iVar9].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((newrhs->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar4;
  *(undefined8 *)&pnVar6[iVar9].m_backend.data = uVar2;
  *(undefined8 *)((long)&pnVar6[iVar9].m_backend.data + 8) = uVar3;
  pnVar6[iVar9].m_backend.exp = (newrhs->m_backend).exp;
  pnVar6[iVar9].m_backend.neg = (newrhs->m_backend).neg;
  iVar5 = (newrhs->m_backend).prec_elem;
  pnVar6[iVar9].m_backend.fpclass = (newrhs->m_backend).fpclass;
  pnVar6[iVar9].m_backend.prec_elem = iVar5;
  iVar9 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar6 = (this->object).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar6[iVar9].m_backend.data + 0x20) =
       *(undefined8 *)((newobj->m_backend).data._M_elems + 8);
  uVar2 = *(undefined8 *)(newobj->m_backend).data._M_elems;
  uVar3 = *(undefined8 *)((newobj->m_backend).data._M_elems + 2);
  uVar4 = *(undefined8 *)((newobj->m_backend).data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar6[iVar9].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((newobj->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar4;
  *(undefined8 *)&pnVar6[iVar9].m_backend.data = uVar2;
  *(undefined8 *)((long)&pnVar6[iVar9].m_backend.data + 8) = uVar3;
  pnVar6[iVar9].m_backend.exp = (newobj->m_backend).exp;
  pnVar6[iVar9].m_backend.neg = (newobj->m_backend).neg;
  iVar5 = (newobj->m_backend).prec_elem;
  pnVar6[iVar9].m_backend.fpclass = (newobj->m_backend).fpclass;
  pnVar6[iVar9].m_backend.prec_elem = iVar5;
  (this->scaleExp).data
  [(this->
   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).set.thenum] = *newscaleExp;
  pSVar7 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::create(&this->
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,nonzeros);
  *newkey = (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thekey
            [(long)(this->
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).set.thenum + -1];
  return pSVar7;
}

Assistant:

SVectorBase<R>& create(DataKey& newkey, int nonzeros = 0, const R& newlhs = 0, const R& newrhs = 1,
                          const R& newobj = 0, const int& newscaleExp = 0)
   {
      if(num() + 1 > left.dim())
      {
         left.reDim(num() + 1);
         right.reDim(num() + 1);
         object.reDim(num() + 1);
         scaleExp.reSize(num() + 1);
      }

      left[num()] = newlhs;
      right[num()] = newrhs;
      object[num()] = newobj;
      scaleExp[num()] = newscaleExp;

      return *SVSetBase<R>::create(newkey, nonzeros);
   }